

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.cpp
# Opt level: O0

void __thiscall gui::Group::handleMouseWheelScroll(Group *this)

{
  Vector2f *in_stack_00000018;
  float in_stack_00000020;
  Wheel in_stack_00000024;
  Group *in_stack_00000028;
  
  handleMouseWheelScroll(in_stack_00000028,in_stack_00000024,in_stack_00000020,in_stack_00000018);
  return;
}

Assistant:

bool Group::handleMouseWheelScroll(sf::Mouse::Wheel wheel, float delta, const sf::Vector2f& mouseParent) {
    auto mouseLocal = toLocalSpace(mouseParent);
    auto widget = getWidgetUnderMouse(mouseLocal);
    if (widget == nullptr || !widget->handleMouseWheelScroll(wheel, delta, mouseLocal)) {
        return baseClass::handleMouseWheelScroll(wheel, delta, mouseParent);
    } else {
        return true;
    }
}